

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cc
# Opt level: O2

void __thiscall
gimage::Polygon::getVEdges
          (Polygon *this,vector<gimage::VEdge,_std::allocator<gimage::VEdge>_> *list)

{
  ulong uVar1;
  pointer pSVar2;
  pointer pSVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  VEdge v;
  
  if (*(long *)(list + 8) != *(long *)list) {
    *(long *)(list + 8) = *(long *)list;
  }
  pSVar2 = (this->vertex).
           super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pSVar3 = (this->vertex).
           super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar6 = 8;
  uVar1 = 0;
  uVar5 = ((long)pSVar3 - (long)pSVar2 >> 4) - 1;
  while (uVar4 = uVar1, uVar4 < (ulong)((long)pSVar3 - (long)pSVar2 >> 4)) {
    VEdge::VEdge(&v,*(long *)((long)pSVar2->v + lVar6 + -8),*(long *)((long)pSVar2->v + lVar6),
                 pSVar2[uVar5].v[0],pSVar2[uVar5].v[1]);
    if (v.ymin < v.ymax) {
      std::vector<gimage::VEdge,_std::allocator<gimage::VEdge>_>::push_back(list,&v);
    }
    pSVar2 = (this->vertex).
             super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pSVar3 = (this->vertex).
             super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    lVar6 = lVar6 + 0x10;
    uVar5 = uVar4;
    uVar1 = uVar4 + 1;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<gimage::VEdge*,std::vector<gimage::VEdge,std::allocator<gimage::VEdge>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(gimage::VEdge_const&,gimage::VEdge_const&)>>
            (*(VEdge **)list,*(VEdge **)(list + 8),
             (_Iter_comp_iter<bool_(*)(const_gimage::VEdge_&,_const_gimage::VEdge_&)>)0x14200b);
  return;
}

Assistant:

void Polygon::getVEdges(std::vector<VEdge> &list) const
{
  list.clear();

  size_t j=vertex.size()-1;
  for (size_t i=0; i<vertex.size(); i++)
  {
    VEdge v(vertex[i][0], vertex[i][1], vertex[j][0], vertex[j][1]);

    if (v.isValid())
    {
      list.push_back(v);
    }

    j=i;
  }

  std::sort(list.begin(), list.end(), compareY);
}